

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_tex_parameteriiv(NegativeTestContext *ctx)

{
  bool bVar1;
  deBool dVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  NotSupportedError *this;
  allocator<char> local_49;
  string local_48;
  GLint local_28 [2];
  GLint params [1];
  NegativeTestContext *ctx_local;
  
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    pRVar3 = NegativeTestContext::getRenderContext(ctx);
    ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    requiredApiType = glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(ctxType,requiredApiType);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      local_28[0] = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,
                 "GL_INVALID_ENUM is generated if target or pname is not an accepted value.",
                 &local_49);
      NegativeTestContext::beginSection(ctx,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      glu::CallLogWrapper::glGetTexParameterIiv
                (&ctx->super_CallLogWrapper,0xffffffff,0x2800,local_28);
      NegativeTestContext::expectError(ctx,0x500);
      glu::CallLogWrapper::glGetTexParameterIiv
                (&ctx->super_CallLogWrapper,0xde1,0xffffffff,local_28);
      NegativeTestContext::expectError(ctx,0x500);
      glu::CallLogWrapper::glGetTexParameterIiv
                (&ctx->super_CallLogWrapper,0xffffffff,0xffffffff,local_28);
      NegativeTestContext::expectError(ctx,0x500);
      NegativeTestContext::endSection(ctx);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeStateApiTests.cpp"
             ,0x1df);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void get_tex_parameteriiv (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a higher context version.");

	GLint params[1] = { 0 };

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetTexParameterIiv(-1, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameterIiv(GL_TEXTURE_2D, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameterIiv(-1, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}